

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer_device.cpp
# Opt level: O3

uint embree::postIntersect(TutorialData *data,Ray *ray,DifferentialGeometry *dg)

{
  float fVar1;
  ISPCType IVar2;
  uint uVar3;
  ISPCInstanceArray *instanceArray;
  float fVar4;
  float fVar5;
  RTCGeometry pRVar6;
  ISPCInstance *instance;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  
  pRVar6 = (RTCGeometry)data->ispc_scene->geometries;
  fVar15 = 0.0;
  fVar16 = 0.0;
  fVar17 = 1.0;
  fVar18 = 0.0;
  fVar11 = 0.0;
  fVar12 = 1.0;
  fVar13 = 0.0;
  fVar14 = 0.0;
  fVar7 = 1.0;
  fVar8 = 0.0;
  fVar9 = 0.0;
  fVar10 = 0.0;
  if ((ulong)ray->instID[0] != 0xffffffff) {
    fVar1 = (ray->dir).field_0.m128[3];
    instanceArray = *(ISPCInstanceArray **)(pRVar6 + (ulong)ray->instID[0] * 8);
    IVar2 = (instanceArray->geom).type;
    if (IVar2 == INSTANCE_ARRAY) {
      calculate_interpolated_space
                ((AffineSpace3fa *)&local_68.field_1,instanceArray,ray->instPrimID[0],fVar1);
    }
    else {
      if (IVar2 != INSTANCE) goto LAB_0012009b;
      calculate_interpolated_space
                ((AffineSpace3fa *)&local_68.field_1,(ISPCInstance *)instanceArray,fVar1);
    }
    fVar7 = local_68.m128[0] * 1.0 + local_68.m128[1] * 0.0 + local_68.m128[2] * 0.0;
    fVar8 = local_68.m128[0] * 0.0 + local_68.m128[1] * 1.0 + local_68.m128[2] * 0.0;
    fVar9 = local_68.m128[0] * 0.0 + local_68.m128[1] * 0.0 + local_68.m128[2] * 1.0;
    fVar10 = local_68.m128[0] * 0.0 + local_68.m128[1] * 0.0 + local_68.m128[2] * 0.0;
    fVar11 = local_58 * 1.0 + fStack_54 * 0.0 + fStack_50 * 0.0;
    fVar12 = local_58 * 0.0 + fStack_54 * 1.0 + fStack_50 * 0.0;
    fVar13 = local_58 * 0.0 + fStack_54 * 0.0 + fStack_50 * 1.0;
    fVar14 = local_58 * 0.0 + fStack_54 * 0.0 + fStack_50 * 0.0;
    fVar15 = local_48 * 1.0 + fStack_44 * 0.0 + fStack_40 * 0.0;
    fVar16 = local_48 * 0.0 + fStack_44 * 1.0 + fStack_40 * 0.0;
    fVar17 = local_48 * 0.0 + fStack_44 * 0.0 + fStack_40 * 1.0;
    fVar18 = local_48 * 0.0 + fStack_44 * 0.0 + fStack_40 * 0.0;
    pRVar6 = instanceArray->child[1].geometry;
  }
LAB_0012009b:
  uVar3 = *(uint *)(*(long *)(pRVar6 + (ulong)ray->geomID * 8) + 0x10);
  fVar1 = (dg->Ng).field_0.m128[0];
  fVar4 = (dg->Ng).field_0.m128[1];
  fVar5 = (dg->Ng).field_0.m128[2];
  (dg->Ng).field_0.m128[0] = fVar1 * fVar7 + fVar4 * fVar11 + fVar5 * fVar15;
  (dg->Ng).field_0.m128[1] = fVar1 * fVar8 + fVar4 * fVar12 + fVar5 * fVar16;
  (dg->Ng).field_0.m128[2] = fVar1 * fVar9 + fVar4 * fVar13 + fVar5 * fVar17;
  (dg->Ng).field_0.m128[3] = fVar1 * fVar10 + fVar4 * fVar14 + fVar5 * fVar18;
  fVar1 = (dg->Ns).field_0.m128[0];
  fVar4 = (dg->Ns).field_0.m128[1];
  fVar5 = (dg->Ns).field_0.m128[2];
  (dg->Ns).field_0.m128[0] = fVar1 * fVar7 + fVar4 * fVar11 + fVar5 * fVar15;
  (dg->Ns).field_0.m128[1] = fVar1 * fVar8 + fVar4 * fVar12 + fVar5 * fVar16;
  (dg->Ns).field_0.m128[2] = fVar1 * fVar9 + fVar4 * fVar13 + fVar5 * fVar17;
  (dg->Ns).field_0.m128[3] = fVar1 * fVar10 + fVar4 * fVar14 + fVar5 * fVar18;
  return uVar3;
}

Assistant:

unsigned int postIntersect(const TutorialData& data, const Ray& ray, DifferentialGeometry& dg)
{
  AffineSpace3fa local2world = AffineSpace3fa::scale(Vec3fa(1));
  ISPCGeometry** geometries = data.ispc_scene->geometries;
  
  for (int i=0; i<RTC_MAX_INSTANCE_LEVEL_COUNT; i++)
  {
    const unsigned int instID = ray.instID[i];
    if (instID == -1) break;

    if (geometries[instID]->type == INSTANCE) {
      ISPCInstance* instance = (ISPCInstancePtr) geometries[instID];
      local2world = local2world * calculate_interpolated_space(instance,ray.time());

      assert(instance->child->type == GROUP);
      geometries = ((ISPCGroup*)instance->child)->geometries;
    }
#if defined(RTC_GEOMETRY_INSTANCE_ARRAY)
    else if (geometries[instID]->type == INSTANCE_ARRAY) {
      ISPCInstanceArray* instanceArray = (ISPCInstanceArrayPtr) geometries[instID];
      local2world = local2world * calculate_interpolated_space(instanceArray,ray.instPrimID[i],ray.time());
      assert(instanceArray->child->type == GROUP);
      geometries = ((ISPCGroup*)instanceArray->child)->geometries;
    }
#endif
  }

  ISPCGeometry* mesh = geometries[ray.geomID];
  unsigned int materialID = mesh->materialID;
  
  dg.Ng = xfmVector(local2world,dg.Ng);
  dg.Ns = xfmVector(local2world,dg.Ns);
  
  return materialID;
}